

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O2

int Dau_DsdToGia_rec(Gia_Man_t *pGia,char *pStr,char **p,int *pMatches,int *pLits,Vec_Int_t *vCover)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  byte *pbVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  byte *pbVar14;
  uint c;
  byte *pString;
  bool bVar15;
  int *local_290;
  int Temp [3];
  Vec_Int_t vLeaves;
  int pFans [12];
  
  pbVar14 = (byte *)*p;
  bVar1 = *pbVar14;
  bVar15 = bVar1 == 0x21;
  pString = pbVar14;
  if (bVar15) {
    pString = pbVar14 + 1;
    *p = (char *)pString;
    bVar1 = pbVar14[1];
  }
  c = (uint)bVar15;
  if ((byte)(bVar1 + 0x9f) < 0xc) {
    iVar3 = pLits[(ulong)bVar1 - 0x61];
  }
  else {
    if (bVar1 != 0x5b) {
      if (bVar1 == 0x3c) {
        lVar12 = (long)pMatches[(long)pString - (long)pStr];
        lVar13 = 0;
        local_290 = pLits;
        if (pStr[lVar12 + 1] == '{') {
          pcVar6 = pStr + lVar12 + 1;
          *p = pcVar6;
          if ((*pcVar6 != '{') ||
             (pcVar6 = pStr + pMatches[(long)pcVar6 - (long)pStr], *pcVar6 != '}')) {
            __assert_fail("**p == \'{\' && *q2 == \'}\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                          ,0x13b,
                          "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                         );
          }
          pcVar11 = pStr + lVar12 + 2;
          *p = pcVar11;
          lVar13 = 0;
          while (pcVar11 < pcVar6) {
            iVar4 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
            pFans[lVar13] = iVar4;
            pcVar11 = *p + 1;
            *p = pcVar11;
            lVar13 = lVar13 + 1;
          }
          if (pcVar11 != pcVar6) {
            __assert_fail("*p == q2",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                          ,0x13e,
                          "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                         );
          }
          lVar12 = (long)pMatches[(long)pString - (long)pStr];
          local_290 = pFans;
        }
        *p = (char *)pString;
        if ((*pString != 0x3c) || (pbVar14 = (byte *)(pStr + lVar12), *pbVar14 != 0x3e)) {
          __assert_fail("**p == \'<\' && *q == \'>\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                        ,0x146,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        pbVar8 = pString;
        if ((uint)lVar13 != 0) {
          while (pbVar8 < pbVar14) {
            bVar1 = *pbVar8;
            pbVar8 = pbVar8 + 1;
            if ((uint)lVar13 <= (uint)(byte)(bVar1 + 0x9f) && (byte)(bVar1 + 0x9f) < 0x1a) {
              __assert_fail("*pOld - \'a\' < nVars",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                            ,0x14b,
                            "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                           );
            }
          }
        }
        lVar13 = 0;
        while( true ) {
          pbVar8 = pString + 1;
          *p = (char *)pbVar8;
          if (pbVar14 <= pbVar8) break;
          iVar4 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,local_290,vCover);
          *(int *)((long)Temp + lVar13) = iVar4;
          lVar13 = lVar13 + 4;
          pString = (byte *)*p;
        }
        if (lVar13 != 0xc) {
          __assert_fail("pTemp == Temp + 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                        ,0x14f,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        if (pbVar8 != pbVar14) {
          __assert_fail("*p == q",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                        ,0x150,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        if (pbVar14[1] == 0x7b) {
          *p = (char *)(pString + 2);
          if ((pString[2] != 0x7b) || (pStr[pMatches[(long)(pString + 2) - (long)pStr]] != '}')) {
            __assert_fail("**p == \'{\' && *q == \'}\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                          ,0x154,
                          "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                         );
          }
          *p = pStr + pMatches[(long)(pString + 2) - (long)pStr];
        }
        if (pGia->pMuxes == (uint *)0x0) {
          iVar4 = Gia_ManHashMux(pGia,Temp[0],Temp[1],Temp[2]);
        }
        else {
          iVar4 = Gia_ManHashMuxReal(pGia,Temp[0],Temp[1],Temp[2]);
        }
        iVar3 = Abc_Lit2Var(iVar4);
        pGVar7 = Gia_ManObj(pGia,iVar3);
        uVar9 = *(ulong *)pGVar7;
        uVar10 = uVar9 & 0x1fffffff;
        if (uVar10 != 0x1fffffff && -1 < (int)uVar9) {
          if (pGia->pMuxes == (uint *)0x0) {
            if ((~*(uint *)(pGVar7 + -uVar10) & 0x1fffffff) != 0 &&
                -1 < (int)*(uint *)(pGVar7 + -uVar10)) {
              Gia_ObjSetAndLevel(pGia,pGVar7 + -uVar10);
              uVar9 = *(ulong *)pGVar7;
            }
            uVar9 = (ulong)((uint)(uVar9 >> 0x20) & 0x1fffffff);
            if ((~*(uint *)(pGVar7 + -uVar9) & 0x1fffffff) != 0 &&
                -1 < (int)*(uint *)(pGVar7 + -uVar9)) {
              Gia_ObjSetAndLevel(pGia,pGVar7 + -uVar9);
            }
            Gia_ObjSetAndLevel(pGia,pGVar7);
          }
          else {
            Gia_ObjSetMuxLevel(pGia,pGVar7);
          }
        }
      }
      else {
        if (bVar1 == 0x28) {
          iVar4 = pMatches[(long)pString - (long)pStr];
          if (pStr[iVar4] != ')') {
            __assert_fail("**p == \'(\' && *q == \')\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                          ,0x115,
                          "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                         );
          }
          iVar3 = 0;
          while (*p = (char *)(pString + 1), pString + 1 < pStr + iVar4) {
            iVar2 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
            Dau_DsdAddToArray(pGia,pFans,iVar3,iVar2);
            iVar3 = iVar3 + 1;
            pString = (byte *)*p;
          }
          iVar3 = Dau_DsdBalance(pGia,pFans,iVar3,1);
          if (*p != pStr + iVar4) {
            __assert_fail("*p == q",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                          ,0x11c,
                          "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                         );
          }
          goto LAB_0040ef4e;
        }
        if (5 < (byte)(bVar1 + 0xbf) && 9 < (byte)(bVar1 - 0x30)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                        ,0x184,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        iVar3 = Abc_TtReadHex((word *)pFans,(char *)pString);
        iVar4 = 1 << ((char)iVar3 - 2U & 0x1f);
        if (iVar3 < 3) {
          iVar4 = 1;
        }
        pcVar11 = *p;
        pcVar6 = pcVar11 + iVar4;
        *p = pcVar6;
        if ((pcVar11[iVar4] != '{') ||
           (pcVar11 = pStr + pMatches[(long)pcVar6 - (long)pStr], *pcVar11 != '}')) {
          __assert_fail("**p == \'{\' && *q == \'}\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                        ,0x173,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        pcVar6 = pcVar6 + 1;
        *p = pcVar6;
        lVar13 = 0;
        while (pcVar6 < pcVar11) {
          iVar4 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
          Temp[lVar13] = iVar4;
          pcVar6 = *p + 1;
          *p = pcVar6;
          lVar13 = lVar13 + 1;
        }
        if (iVar3 != (int)lVar13) {
          __assert_fail("i == nVars",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                        ,0x176,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        if (pcVar6 != pcVar11) {
          __assert_fail("*p == q",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                        ,0x177,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        vLeaves.pArray = Temp;
        iVar2 = pGia->nObjs;
        vLeaves.nCap = iVar3;
        vLeaves.nSize = iVar3;
        iVar4 = Kit_TruthToGia(pGia,(uint *)pFans,iVar3,vCover,&vLeaves,1);
        for (; iVar2 < pGia->nObjs; iVar2 = iVar2 + 1) {
          pGVar7 = Gia_ManObj(pGia,iVar2);
          if ((pGia->fGiaSimple == 0) && (iVar3 = Gia_ObjIsBuf(pGVar7), iVar3 != 0)) {
            if (((int)(uint)*(undefined8 *)pGVar7 < 0) ||
               (uVar5 = (uint)*(undefined8 *)pGVar7 & 0x1fffffff, uVar5 == 0x1fffffff)) {
              __assert_fail("Gia_ObjIsAnd(pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x219,"void Gia_ObjSetBufLevel(Gia_Man_t *, Gia_Obj_t *)");
            }
            iVar3 = Gia_ObjLevel(pGia,pGVar7 + -(ulong)uVar5);
            Gia_ObjSetLevel(pGia,pGVar7,iVar3);
          }
          else {
            iVar3 = Gia_ObjIsMux(pGia,pGVar7);
            if (iVar3 == 0) {
              iVar3 = Gia_ObjIsXor(pGVar7);
              if (iVar3 == 0) {
                if ((~*(uint *)pGVar7 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar7) {
                  Gia_ObjSetAndLevel(pGia,pGVar7);
                }
              }
              else {
                Gia_ObjSetXorLevel(pGia,pGVar7);
              }
            }
            else {
              Gia_ObjSetMuxLevel(pGia,pGVar7);
            }
          }
        }
        m_Non1Step = m_Non1Step + 1;
      }
      iVar4 = Abc_LitNotCond(iVar4,c);
      return iVar4;
    }
    iVar4 = pMatches[(long)pString - (long)pStr];
    if (pStr[iVar4] != ']') {
      __assert_fail("**p == \'[\' && *q == \']\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                    ,0x123,
                    "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)")
      ;
    }
    iVar3 = 0;
    while (*p = (char *)(pString + 1), pString + 1 < pStr + iVar4) {
      iVar2 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
      Dau_DsdAddToArray(pGia,pFans,iVar3,iVar2);
      iVar3 = iVar3 + 1;
      pString = (byte *)*p;
    }
    iVar3 = Dau_DsdBalance(pGia,pFans,iVar3,0);
    if (*p != pStr + iVar4) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                    ,0x12a,
                    "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)")
      ;
    }
  }
LAB_0040ef4e:
  iVar4 = Abc_LitNotCond(iVar3,c);
  return iVar4;
}

Assistant:

int Dau_DsdToGia_rec( Gia_Man_t * pGia, char * pStr, char ** p, int * pMatches, int * pLits, Vec_Int_t * vCover )
{
    int fCompl = 0;
    if ( **p == '!' )
        (*p)++, fCompl = 1;
    if ( **p >= 'a' && **p < 'a' + DAU_DSD_MAX_VAR ) // var
        return Abc_LitNotCond( pLits[**p - 'a'], fCompl );
    if ( **p == '(' ) // and/or
    {
        char * q = pStr + pMatches[ *p - pStr ];
        int pFans[DAU_DSD_MAX_VAR], nFans = 0, Fan;
        assert( **p == '(' && *q == ')' );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Fan = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
            Dau_DsdAddToArray( pGia, pFans, nFans++, Fan );
        }
        Fan = Dau_DsdBalance( pGia, pFans, nFans, 1 );
        assert( *p == q );
        return Abc_LitNotCond( Fan, fCompl );
    }
    if ( **p == '[' ) // xor
    {
        char * q = pStr + pMatches[ *p - pStr ];
        int pFans[DAU_DSD_MAX_VAR], nFans = 0, Fan;
        assert( **p == '[' && *q == ']' );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Fan = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
            Dau_DsdAddToArray( pGia, pFans, nFans++, Fan );
        }
        Fan = Dau_DsdBalance( pGia, pFans, nFans, 0 );
        assert( *p == q );
        return Abc_LitNotCond( Fan, fCompl );
    }
    if ( **p == '<' ) // mux
    {
        Gia_Obj_t * pObj;
        int nVars = 0;
        int Temp[3], * pTemp = Temp, Res;
        int Fanins[DAU_DSD_MAX_VAR], * pLits2;
        char * pOld = *p;
        char * q = pStr + pMatches[ *p - pStr ];
        // read fanins
        if ( *(q+1) == '{' )
        {
            char * q2;
            *p = q+1;
            q2 = pStr + pMatches[ *p - pStr ];
            assert( **p == '{' && *q2 == '}' );
            for ( nVars = 0, (*p)++; *p < q2; (*p)++, nVars++ )
                Fanins[nVars] = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
            assert( *p == q2 );
            pLits2 = Fanins;
        }
        else
            pLits2 = pLits;
        // read MUX
        *p = pOld;
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '<' && *q == '>' );
        // verify internal variables
        if ( nVars )
            for ( ; pOld < q; pOld++ )
                if ( *pOld >= 'a' && *pOld <= 'z' )
                    assert( *pOld - 'a' < nVars );
        // derive MUX components
        for ( (*p)++; *p < q; (*p)++ )
            *pTemp++ = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits2, vCover );
        assert( pTemp == Temp + 3 );
        assert( *p == q );
        if ( *(q+1) == '{' ) // and/or
        {
            char * q = pStr + pMatches[ ++(*p) - pStr ];
            assert( **p == '{' && *q == '}' );
            *p = q;
        }
        if ( pGia->pMuxes )
            Res = Gia_ManHashMuxReal( pGia, Temp[0], Temp[1], Temp[2] );
        else
            Res = Gia_ManHashMux( pGia, Temp[0], Temp[1], Temp[2] );
        pObj = Gia_ManObj(pGia, Abc_Lit2Var(Res));
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( pGia->pMuxes )
                Gia_ObjSetMuxLevel( pGia, pObj );
            else 
            {
                if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
                    Gia_ObjSetAndLevel( pGia, Gia_ObjFanin0(pObj) );
                if ( Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) )
                    Gia_ObjSetAndLevel( pGia, Gia_ObjFanin1(pObj) );
                Gia_ObjSetAndLevel( pGia, pObj );
            }
        }
        return Abc_LitNotCond( Res, fCompl );
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        Vec_Int_t vLeaves;  char * q;
        word pFunc[DAU_DSD_MAX_VAR > 6 ? (1 << (DAU_DSD_MAX_VAR-6)) : 1];
        int Fanins[DAU_DSD_MAX_VAR], Res, nObjOld; 
        int i, nVars = Abc_TtReadHex( pFunc, *p );
        *p += Abc_TtHexDigitNum( nVars );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Fanins[i] = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
        assert( i == nVars );
        assert( *p == q );
        vLeaves.nCap = nVars;
        vLeaves.nSize = nVars;
        vLeaves.pArray = Fanins;      
        nObjOld = Gia_ManObjNum(pGia);
        Res = Kit_TruthToGia( pGia, (unsigned *)pFunc, nVars, vCover, &vLeaves, 1 );
//        assert( nVars <= 6 );
//        Res = Dau_DsdToGiaCompose_rec( pGia, pFunc[0], Fanins, nVars );
        for ( i = nObjOld; i < Gia_ManObjNum(pGia); i++ )
            Gia_ObjSetGateLevel( pGia, Gia_ManObj(pGia, i) );
        m_Non1Step++;
        return Abc_LitNotCond( Res, fCompl );
    }
    assert( 0 );
    return 0;
}